

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForceManager.cpp
# Opt level: O2

void __thiscall
OpenMD::ForceManager::selectedShortRangeInteractions
          (ForceManager *this,Molecule *mol1,Molecule *mol2)

{
  SelectionManager *this_00;
  map<OpenMD::Bend_*,_OpenMD::BendDataSet,_std::less<OpenMD::Bend_*>,_std::allocator<std::pair<OpenMD::Bend_*const,_OpenMD::BendDataSet>_>_>
  *this_01;
  map<OpenMD::Inversion_*,_OpenMD::InversionDataSet,_std::less<OpenMD::Inversion_*>,_std::allocator<std::pair<OpenMD::Inversion_*const,_OpenMD::InversionDataSet>_>_>
  *this_02;
  Snapshot *this_03;
  _Base_ptr p_Var1;
  _Base_ptr this_04;
  _Rb_tree<OpenMD::Torsion*,std::pair<OpenMD::Torsion*const,OpenMD::TorsionDataSet>,std::_Select1st<std::pair<OpenMD::Torsion*const,OpenMD::TorsionDataSet>>,std::less<OpenMD::Torsion*>,std::allocator<std::pair<OpenMD::Torsion*const,OpenMD::TorsionDataSet>>>
  *p_Var2;
  _Rb_tree<OpenMD::Bend*,std::pair<OpenMD::Bend*const,OpenMD::BendDataSet>,std::_Select1st<std::pair<OpenMD::Bend*const,OpenMD::BendDataSet>>,std::less<OpenMD::Bend*>,std::allocator<std::pair<OpenMD::Bend*const,OpenMD::BendDataSet>>>
  *this_05;
  bool bVar3;
  iterator iVar4;
  iterator iVar5;
  iterator iVar6;
  RigidBody *pRVar7;
  pointer ppRVar8;
  Bond *pBVar9;
  pointer ppTVar10;
  pointer ppIVar11;
  pointer ppBVar12;
  pointer ppBVar13;
  RealType angle_1;
  RealType angle;
  RealType angle_2;
  potVec selectionPotential;
  key_type local_140;
  key_type local_138;
  _Base_ptr local_130;
  Inversion *local_128;
  key_type local_120;
  _Base_ptr local_118;
  _Base_ptr local_110;
  pair<OpenMD::Inversion_*const,_OpenMD::InversionDataSet> local_108;
  double local_d8;
  double local_d0;
  _Base_ptr local_c8;
  _Rb_tree<OpenMD::Torsion*,std::pair<OpenMD::Torsion*const,OpenMD::TorsionDataSet>,std::_Select1st<std::pair<OpenMD::Torsion*const,OpenMD::TorsionDataSet>>,std::less<OpenMD::Torsion*>,std::allocator<std::pair<OpenMD::Torsion*const,OpenMD::TorsionDataSet>>>
  *local_c0;
  _Base_ptr local_b8;
  _Base_ptr local_b0;
  Vector<double,_7U> local_a8;
  _Rb_tree<OpenMD::Bend*,std::pair<OpenMD::Bend*const,OpenMD::BendDataSet>,std::_Select1st<std::pair<OpenMD::Bend*const,OpenMD::BendDataSet>>,std::less<OpenMD::Bend*>,std::allocator<std::pair<OpenMD::Bend*const,OpenMD::BendDataSet>>>
  *local_70;
  Vector<double,_7U> local_68;
  
  local_108.first = (Inversion *)0x0;
  Vector<double,_7U>::Vector(&local_a8,(double *)&local_108);
  ppRVar8 = (mol1->rigidBodies_).
            super__Vector_base<OpenMD::RigidBody_*,_std::allocator<OpenMD::RigidBody_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppRVar8 !=
      (mol1->rigidBodies_).
      super__Vector_base<OpenMD::RigidBody_*,_std::allocator<OpenMD::RigidBody_*>_>._M_impl.
      super__Vector_impl_data._M_finish) goto LAB_0018004a;
  pRVar7 = (RigidBody *)0x0;
  while (pRVar7 != (RigidBody *)0x0) {
    RigidBody::updateAtoms(pRVar7);
    ppRVar8 = ppRVar8 + 1;
    pRVar7 = (RigidBody *)0x0;
    if (ppRVar8 !=
        (mol1->rigidBodies_).
        super__Vector_base<OpenMD::RigidBody_*,_std::allocator<OpenMD::RigidBody_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
LAB_0018004a:
      pRVar7 = *ppRVar8;
    }
  }
  ppBVar12 = (mol1->bonds_).super__Vector_base<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  if (ppBVar12 ==
      (mol1->bonds_).super__Vector_base<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    pBVar9 = (Bond *)0x0;
  }
  else {
    pBVar9 = *ppBVar12;
  }
  this_00 = &this->seleMan_;
  local_d0 = 0.0;
  while (ppBVar12 = ppBVar12 + 1, pBVar9 != (Bond *)0x0) {
    Bond::calcForce(pBVar9,this->doParticlePot_);
    local_d0 = local_d0 + pBVar9->potential_;
    if ((this->doPotentialSelection_ == true) &&
       ((bVar3 = SelectionManager::isSelected
                           (this_00,&(*(pBVar9->super_ShortRangeInteraction).atoms_.
                                       super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->super_StuntDouble
                           ), bVar3 ||
        (bVar3 = SelectionManager::isSelected
                           (this_00,&(pBVar9->super_ShortRangeInteraction).atoms_.
                                     super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>
                                     ._M_impl.super__Vector_impl_data._M_start[1]->super_StuntDouble
                           ), bVar3)))) {
      local_a8.data_[6] = pBVar9->potential_ + local_a8.data_[6];
    }
    if (ppBVar12 ==
        (mol1->bonds_).super__Vector_base<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      pBVar9 = (Bond *)0x0;
    }
    else {
      pBVar9 = *ppBVar12;
    }
  }
  ppBVar13 = (mol1->bends_).super__Vector_base<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  if (ppBVar13 ==
      (mol1->bends_).super__Vector_base<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    local_128 = (Inversion *)0x0;
  }
  else {
    local_128 = (Inversion *)*ppBVar13;
  }
  this_01 = &this->bendDataSets;
  local_c8 = &(this->bendDataSets)._M_t._M_impl.super__Rb_tree_header._M_header;
  local_d8 = 0.0;
  while (ppBVar13 = ppBVar13 + 1, local_128 != (Inversion *)0x0) {
    (*(local_128->super_ShortRangeInteraction)._vptr_ShortRangeInteraction[9])
              (local_128,&local_138,(ulong)this->doParticlePot_);
    local_110 = (_Base_ptr)local_128->inversionType_;
    iVar4 = std::
            _Rb_tree<OpenMD::Bend_*,_std::pair<OpenMD::Bend_*const,_OpenMD::BendDataSet>,_std::_Select1st<std::pair<OpenMD::Bend_*const,_OpenMD::BendDataSet>_>,_std::less<OpenMD::Bend_*>,_std::allocator<std::pair<OpenMD::Bend_*const,_OpenMD::BendDataSet>_>_>
            ::find(&this_01->_M_t,(key_type *)&local_128);
    if (iVar4._M_node == local_c8) {
      local_108.first = local_128;
      local_108.second.deltaV = 0.0;
      local_108.second.prev.angle = (RealType)local_138;
      local_108.second.prev.potential = (RealType)local_110;
      local_108.second.curr.angle = (RealType)local_138;
      local_108.second.curr.potential = (RealType)local_110;
      std::
      _Rb_tree<OpenMD::Bend*,std::pair<OpenMD::Bend*const,OpenMD::BendDataSet>,std::_Select1st<std::pair<OpenMD::Bend*const,OpenMD::BendDataSet>>,std::less<OpenMD::Bend*>,std::allocator<std::pair<OpenMD::Bend*const,OpenMD::BendDataSet>>>
      ::_M_insert_unique<std::pair<OpenMD::Bend*const,OpenMD::BendDataSet>>
                ((_Rb_tree<OpenMD::Bend*,std::pair<OpenMD::Bend*const,OpenMD::BendDataSet>,std::_Select1st<std::pair<OpenMD::Bend*const,OpenMD::BendDataSet>>,std::less<OpenMD::Bend*>,std::allocator<std::pair<OpenMD::Bend*const,OpenMD::BendDataSet>>>
                  *)this_01,(pair<OpenMD::Bend_*const,_OpenMD::BendDataSet> *)&local_108);
    }
    else {
      p_Var1 = iVar4._M_node[2]._M_parent;
      iVar4._M_node[1]._M_left = *(_Base_ptr *)(iVar4._M_node + 2);
      iVar4._M_node[1]._M_right = p_Var1;
      *(key_type *)(iVar4._M_node + 2) = local_138;
      iVar4._M_node[2]._M_parent = local_110;
      iVar4._M_node[1]._M_parent = (_Base_ptr)ABS((double)local_110 - (double)p_Var1);
    }
    if ((this->doPotentialSelection_ == true) &&
       (((bVar3 = SelectionManager::isSelected
                            (this_00,&(*(local_128->super_ShortRangeInteraction).atoms_.
                                        super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>
                                        ._M_impl.super__Vector_impl_data._M_start)->
                                      super_StuntDouble), bVar3 ||
         (bVar3 = SelectionManager::isSelected
                            (this_00,&(local_128->super_ShortRangeInteraction).atoms_.
                                      super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>
                                      ._M_impl.super__Vector_impl_data._M_start[1]->
                                      super_StuntDouble), bVar3)) ||
        (bVar3 = SelectionManager::isSelected
                           (this_00,&(local_128->super_ShortRangeInteraction).atoms_.
                                     super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>
                                     ._M_impl.super__Vector_impl_data._M_start[2]->super_StuntDouble
                           ), bVar3)))) {
      local_a8.data_[6] = (double)local_128->inversionType_ + local_a8.data_[6];
    }
    if (ppBVar13 ==
        (mol1->bends_).super__Vector_base<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      local_128 = (Inversion *)0x0;
    }
    else {
      local_128 = (Inversion *)*ppBVar13;
    }
    local_d8 = local_d8 + (double)local_110;
  }
  ppTVar10 = (mol1->torsions_).
             super__Vector_base<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  if (ppTVar10 ==
      (mol1->torsions_).super__Vector_base<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    local_138 = (Inversion *)0x0;
  }
  else {
    local_138 = (key_type)*ppTVar10;
  }
  local_c0 = (_Rb_tree<OpenMD::Torsion*,std::pair<OpenMD::Torsion*const,OpenMD::TorsionDataSet>,std::_Select1st<std::pair<OpenMD::Torsion*const,OpenMD::TorsionDataSet>>,std::less<OpenMD::Torsion*>,std::allocator<std::pair<OpenMD::Torsion*const,OpenMD::TorsionDataSet>>>
              *)&this->torsionDataSets;
  local_b0 = &(this->torsionDataSets)._M_t._M_impl.super__Rb_tree_header._M_header;
  local_110 = (_Base_ptr)0x0;
  local_128 = (Inversion *)0x0;
  local_70 = (_Rb_tree<OpenMD::Bend*,std::pair<OpenMD::Bend*const,OpenMD::BendDataSet>,std::_Select1st<std::pair<OpenMD::Bend*const,OpenMD::BendDataSet>>,std::less<OpenMD::Bend*>,std::allocator<std::pair<OpenMD::Bend*const,OpenMD::BendDataSet>>>
              *)this_01;
  while (p_Var2 = local_c0, ppTVar10 = ppTVar10 + 1, local_138 != (Inversion *)0x0) {
    (*(local_138->super_ShortRangeInteraction)._vptr_ShortRangeInteraction[9])
              (local_138,&local_140,(ulong)this->doParticlePot_);
    local_118 = *(_Base_ptr *)((long)&(local_138->name_).field_2 + 8);
    iVar5 = std::
            _Rb_tree<OpenMD::Torsion_*,_std::pair<OpenMD::Torsion_*const,_OpenMD::TorsionDataSet>,_std::_Select1st<std::pair<OpenMD::Torsion_*const,_OpenMD::TorsionDataSet>_>,_std::less<OpenMD::Torsion_*>,_std::allocator<std::pair<OpenMD::Torsion_*const,_OpenMD::TorsionDataSet>_>_>
            ::find((_Rb_tree<OpenMD::Torsion_*,_std::pair<OpenMD::Torsion_*const,_OpenMD::TorsionDataSet>,_std::_Select1st<std::pair<OpenMD::Torsion_*const,_OpenMD::TorsionDataSet>_>,_std::less<OpenMD::Torsion_*>,_std::allocator<std::pair<OpenMD::Torsion_*const,_OpenMD::TorsionDataSet>_>_>
                    *)p_Var2,(key_type *)&local_138);
    if (iVar5._M_node == local_b0) {
      local_108.first = local_138;
      local_108.second.deltaV = 0.0;
      local_108.second.prev.angle = (RealType)local_140;
      local_108.second.prev.potential = (RealType)local_118;
      local_108.second.curr.angle = (RealType)local_140;
      local_108.second.curr.potential = (RealType)local_118;
      std::
      _Rb_tree<OpenMD::Torsion*,std::pair<OpenMD::Torsion*const,OpenMD::TorsionDataSet>,std::_Select1st<std::pair<OpenMD::Torsion*const,OpenMD::TorsionDataSet>>,std::less<OpenMD::Torsion*>,std::allocator<std::pair<OpenMD::Torsion*const,OpenMD::TorsionDataSet>>>
      ::_M_insert_unique<std::pair<OpenMD::Torsion*const,OpenMD::TorsionDataSet>>
                (p_Var2,(pair<OpenMD::Torsion_*const,_OpenMD::TorsionDataSet> *)&local_108);
    }
    else {
      p_Var1 = iVar5._M_node[2]._M_parent;
      iVar5._M_node[1]._M_left = *(_Base_ptr *)(iVar5._M_node + 2);
      iVar5._M_node[1]._M_right = p_Var1;
      *(key_type *)(iVar5._M_node + 2) = local_140;
      iVar5._M_node[2]._M_parent = local_118;
      iVar5._M_node[1]._M_parent = (_Base_ptr)ABS((double)local_118 - (double)p_Var1);
    }
    if ((this->doPotentialSelection_ == true) &&
       (((bVar3 = SelectionManager::isSelected
                            (this_00,&(*(local_138->super_ShortRangeInteraction).atoms_.
                                        super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>
                                        ._M_impl.super__Vector_impl_data._M_start)->
                                      super_StuntDouble), bVar3 ||
         (bVar3 = SelectionManager::isSelected
                            (this_00,&(local_138->super_ShortRangeInteraction).atoms_.
                                      super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>
                                      ._M_impl.super__Vector_impl_data._M_start[1]->
                                      super_StuntDouble), bVar3)) ||
        ((bVar3 = SelectionManager::isSelected
                            (this_00,&(local_138->super_ShortRangeInteraction).atoms_.
                                      super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>
                                      ._M_impl.super__Vector_impl_data._M_start[2]->
                                      super_StuntDouble), bVar3 ||
         (bVar3 = SelectionManager::isSelected
                            (this_00,&(local_138->super_ShortRangeInteraction).atoms_.
                                      super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>
                                      ._M_impl.super__Vector_impl_data._M_start[3]->
                                      super_StuntDouble), bVar3)))))) {
      local_a8.data_[6] = *(double *)((long)&(local_138->name_).field_2 + 8) + local_a8.data_[6];
    }
    if (ppTVar10 ==
        (mol1->torsions_).super__Vector_base<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      local_138 = (Inversion *)0x0;
    }
    else {
      local_138 = (key_type)*ppTVar10;
    }
    local_110 = (_Base_ptr)((double)local_110 + (double)local_118);
  }
  ppIVar11 = (mol1->inversions_).
             super__Vector_base<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  if (ppIVar11 ==
      (mol1->inversions_).
      super__Vector_base<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    local_140 = (Inversion *)0x0;
  }
  else {
    local_140 = *ppIVar11;
  }
  this_02 = &this->inversionDataSets;
  local_b8 = &(this->inversionDataSets)._M_t._M_impl.super__Rb_tree_header._M_header;
  local_118 = (_Base_ptr)0x0;
  local_138 = (key_type)0x0;
  while (ppIVar11 = ppIVar11 + 1, local_140 != (Inversion *)0x0) {
    (*(local_140->super_ShortRangeInteraction)._vptr_ShortRangeInteraction[9])
              (local_140,&local_120,(ulong)this->doParticlePot_);
    local_130 = (_Base_ptr)local_140->potential_;
    iVar6 = std::
            _Rb_tree<OpenMD::Inversion_*,_std::pair<OpenMD::Inversion_*const,_OpenMD::InversionDataSet>,_std::_Select1st<std::pair<OpenMD::Inversion_*const,_OpenMD::InversionDataSet>_>,_std::less<OpenMD::Inversion_*>,_std::allocator<std::pair<OpenMD::Inversion_*const,_OpenMD::InversionDataSet>_>_>
            ::find(&this_02->_M_t,&local_140);
    if (iVar6._M_node == local_b8) {
      local_108.first = local_140;
      local_108.second.deltaV = 0.0;
      local_108.second.prev.angle = (RealType)local_120;
      local_108.second.prev.potential = (RealType)local_130;
      local_108.second.curr.angle = (RealType)local_120;
      local_108.second.curr.potential = (RealType)local_130;
      std::
      _Rb_tree<OpenMD::Inversion*,std::pair<OpenMD::Inversion*const,OpenMD::InversionDataSet>,std::_Select1st<std::pair<OpenMD::Inversion*const,OpenMD::InversionDataSet>>,std::less<OpenMD::Inversion*>,std::allocator<std::pair<OpenMD::Inversion*const,OpenMD::InversionDataSet>>>
      ::_M_insert_unique<std::pair<OpenMD::Inversion*const,OpenMD::InversionDataSet>>
                ((_Rb_tree<OpenMD::Inversion*,std::pair<OpenMD::Inversion*const,OpenMD::InversionDataSet>,std::_Select1st<std::pair<OpenMD::Inversion*const,OpenMD::InversionDataSet>>,std::less<OpenMD::Inversion*>,std::allocator<std::pair<OpenMD::Inversion*const,OpenMD::InversionDataSet>>>
                  *)this_02,&local_108);
    }
    else {
      p_Var1 = iVar6._M_node[2]._M_parent;
      iVar6._M_node[1]._M_left = *(_Base_ptr *)(iVar6._M_node + 2);
      iVar6._M_node[1]._M_right = p_Var1;
      *(key_type *)(iVar6._M_node + 2) = local_120;
      iVar6._M_node[2]._M_parent = local_130;
      iVar6._M_node[1]._M_parent = (_Base_ptr)ABS((double)local_130 - (double)p_Var1);
    }
    if ((this->doPotentialSelection_ == true) &&
       ((((bVar3 = SelectionManager::isSelected
                             (this_00,&(*(local_140->super_ShortRangeInteraction).atoms_.
                                         super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>
                                         ._M_impl.super__Vector_impl_data._M_start)->
                                       super_StuntDouble), bVar3 ||
          (bVar3 = SelectionManager::isSelected
                             (this_00,&(local_140->super_ShortRangeInteraction).atoms_.
                                       super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>
                                       ._M_impl.super__Vector_impl_data._M_start[1]->
                                       super_StuntDouble), bVar3)) ||
         (bVar3 = SelectionManager::isSelected
                            (this_00,&(local_140->super_ShortRangeInteraction).atoms_.
                                      super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>
                                      ._M_impl.super__Vector_impl_data._M_start[2]->
                                      super_StuntDouble), bVar3)) ||
        (bVar3 = SelectionManager::isSelected
                           (this_00,&(local_140->super_ShortRangeInteraction).atoms_.
                                     super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>
                                     ._M_impl.super__Vector_impl_data._M_start[3]->super_StuntDouble
                           ), bVar3)))) {
      local_a8.data_[6] = local_140->potential_ + local_a8.data_[6];
    }
    if (ppIVar11 ==
        (mol1->inversions_).
        super__Vector_base<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      local_140 = (Inversion *)0x0;
    }
    else {
      local_140 = *ppIVar11;
    }
    local_118 = (_Base_ptr)((double)local_118 + (double)local_130);
  }
  ppRVar8 = (mol2->rigidBodies_).
            super__Vector_base<OpenMD::RigidBody_*,_std::allocator<OpenMD::RigidBody_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  local_140 = (key_type)0x0;
  if (ppRVar8 !=
      (mol2->rigidBodies_).
      super__Vector_base<OpenMD::RigidBody_*,_std::allocator<OpenMD::RigidBody_*>_>._M_impl.
      super__Vector_impl_data._M_finish) goto LAB_0018064b;
  pRVar7 = (RigidBody *)0x0;
  while (pRVar7 != (RigidBody *)0x0) {
    RigidBody::updateAtoms(pRVar7);
    ppRVar8 = ppRVar8 + 1;
    pRVar7 = (RigidBody *)0x0;
    if (ppRVar8 !=
        (mol2->rigidBodies_).
        super__Vector_base<OpenMD::RigidBody_*,_std::allocator<OpenMD::RigidBody_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
LAB_0018064b:
      pRVar7 = *ppRVar8;
    }
  }
  ppBVar12 = (mol2->bonds_).super__Vector_base<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  if (ppBVar12 !=
      (mol2->bonds_).super__Vector_base<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_>._M_impl.
      super__Vector_impl_data._M_finish) goto LAB_0018067c;
  pBVar9 = (Bond *)0x0;
  while (pBVar9 != (Bond *)0x0) {
    Bond::calcForce(pBVar9,this->doParticlePot_);
    local_d0 = local_d0 + pBVar9->potential_;
    if ((this->doPotentialSelection_ == true) &&
       ((bVar3 = SelectionManager::isSelected
                           (this_00,&(*(pBVar9->super_ShortRangeInteraction).atoms_.
                                       super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->super_StuntDouble
                           ), bVar3 ||
        (bVar3 = SelectionManager::isSelected
                           (this_00,&(pBVar9->super_ShortRangeInteraction).atoms_.
                                     super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>
                                     ._M_impl.super__Vector_impl_data._M_start[1]->super_StuntDouble
                           ), bVar3)))) {
      local_a8.data_[6] = pBVar9->potential_ + local_a8.data_[6];
    }
    ppBVar12 = ppBVar12 + 1;
    pBVar9 = (Bond *)0x0;
    if (ppBVar12 !=
        (mol2->bonds_).super__Vector_base<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
LAB_0018067c:
      pBVar9 = *ppBVar12;
    }
  }
  ppBVar13 = (mol2->bends_).super__Vector_base<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  if (ppBVar13 ==
      (mol2->bends_).super__Vector_base<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    local_128 = (Inversion *)0x0;
  }
  else {
    local_128 = (Inversion *)*ppBVar13;
  }
  while (p_Var2 = local_c0, ppBVar13 = ppBVar13 + 1, local_128 != (Inversion *)0x0) {
    (*(local_128->super_ShortRangeInteraction)._vptr_ShortRangeInteraction[9])
              (local_128,&local_120,(ulong)this->doParticlePot_);
    this_05 = local_70;
    local_130 = (_Base_ptr)local_128->inversionType_;
    iVar4 = std::
            _Rb_tree<OpenMD::Bend_*,_std::pair<OpenMD::Bend_*const,_OpenMD::BendDataSet>,_std::_Select1st<std::pair<OpenMD::Bend_*const,_OpenMD::BendDataSet>_>,_std::less<OpenMD::Bend_*>,_std::allocator<std::pair<OpenMD::Bend_*const,_OpenMD::BendDataSet>_>_>
            ::find((_Rb_tree<OpenMD::Bend_*,_std::pair<OpenMD::Bend_*const,_OpenMD::BendDataSet>,_std::_Select1st<std::pair<OpenMD::Bend_*const,_OpenMD::BendDataSet>_>,_std::less<OpenMD::Bend_*>,_std::allocator<std::pair<OpenMD::Bend_*const,_OpenMD::BendDataSet>_>_>
                    *)local_70,(key_type *)&local_128);
    if (iVar4._M_node == local_c8) {
      local_108.first = local_128;
      local_108.second.deltaV = 0.0;
      local_108.second.prev.angle = (RealType)local_120;
      local_108.second.prev.potential = (RealType)local_130;
      local_108.second.curr.angle = (RealType)local_120;
      local_108.second.curr.potential = (RealType)local_130;
      std::
      _Rb_tree<OpenMD::Bend*,std::pair<OpenMD::Bend*const,OpenMD::BendDataSet>,std::_Select1st<std::pair<OpenMD::Bend*const,OpenMD::BendDataSet>>,std::less<OpenMD::Bend*>,std::allocator<std::pair<OpenMD::Bend*const,OpenMD::BendDataSet>>>
      ::_M_insert_unique<std::pair<OpenMD::Bend*const,OpenMD::BendDataSet>>
                (this_05,(pair<OpenMD::Bend_*const,_OpenMD::BendDataSet> *)&local_108);
    }
    else {
      p_Var1 = iVar4._M_node[2]._M_parent;
      iVar4._M_node[1]._M_left = *(_Base_ptr *)(iVar4._M_node + 2);
      iVar4._M_node[1]._M_right = p_Var1;
      *(key_type *)(iVar4._M_node + 2) = local_120;
      iVar4._M_node[2]._M_parent = local_130;
      iVar4._M_node[1]._M_parent = (_Base_ptr)ABS((double)local_130 - (double)p_Var1);
    }
    if ((this->doPotentialSelection_ == true) &&
       (((bVar3 = SelectionManager::isSelected
                            (this_00,&(*(local_128->super_ShortRangeInteraction).atoms_.
                                        super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>
                                        ._M_impl.super__Vector_impl_data._M_start)->
                                      super_StuntDouble), bVar3 ||
         (bVar3 = SelectionManager::isSelected
                            (this_00,&(local_128->super_ShortRangeInteraction).atoms_.
                                      super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>
                                      ._M_impl.super__Vector_impl_data._M_start[1]->
                                      super_StuntDouble), bVar3)) ||
        (bVar3 = SelectionManager::isSelected
                           (this_00,&(local_128->super_ShortRangeInteraction).atoms_.
                                     super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>
                                     ._M_impl.super__Vector_impl_data._M_start[2]->super_StuntDouble
                           ), bVar3)))) {
      local_a8.data_[6] = (double)local_128->inversionType_ + local_a8.data_[6];
    }
    if (ppBVar13 ==
        (mol2->bends_).super__Vector_base<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      local_128 = (Inversion *)0x0;
    }
    else {
      local_128 = (Inversion *)*ppBVar13;
    }
    local_d8 = local_d8 + (double)local_130;
  }
  ppTVar10 = (mol2->torsions_).
             super__Vector_base<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  if (ppTVar10 ==
      (mol2->torsions_).super__Vector_base<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    local_138 = (Inversion *)0x0;
  }
  else {
    local_138 = (key_type)*ppTVar10;
  }
  local_128 = (Inversion *)0x0;
  local_c8 = (_Base_ptr)this_02;
  while (this_04 = local_c8, ppTVar10 = ppTVar10 + 1, local_138 != (Inversion *)0x0) {
    (*(local_138->super_ShortRangeInteraction)._vptr_ShortRangeInteraction[9])
              (local_138,&local_120,(ulong)this->doParticlePot_);
    local_130 = *(_Base_ptr *)((long)&(local_138->name_).field_2 + 8);
    iVar5 = std::
            _Rb_tree<OpenMD::Torsion_*,_std::pair<OpenMD::Torsion_*const,_OpenMD::TorsionDataSet>,_std::_Select1st<std::pair<OpenMD::Torsion_*const,_OpenMD::TorsionDataSet>_>,_std::less<OpenMD::Torsion_*>,_std::allocator<std::pair<OpenMD::Torsion_*const,_OpenMD::TorsionDataSet>_>_>
            ::find((_Rb_tree<OpenMD::Torsion_*,_std::pair<OpenMD::Torsion_*const,_OpenMD::TorsionDataSet>,_std::_Select1st<std::pair<OpenMD::Torsion_*const,_OpenMD::TorsionDataSet>_>,_std::less<OpenMD::Torsion_*>,_std::allocator<std::pair<OpenMD::Torsion_*const,_OpenMD::TorsionDataSet>_>_>
                    *)p_Var2,(key_type *)&local_138);
    if (iVar5._M_node == local_b0) {
      local_108.first = local_138;
      local_108.second.deltaV = 0.0;
      local_108.second.prev.angle = (RealType)local_120;
      local_108.second.prev.potential = (RealType)local_130;
      local_108.second.curr.angle = (RealType)local_120;
      local_108.second.curr.potential = (RealType)local_130;
      std::
      _Rb_tree<OpenMD::Torsion*,std::pair<OpenMD::Torsion*const,OpenMD::TorsionDataSet>,std::_Select1st<std::pair<OpenMD::Torsion*const,OpenMD::TorsionDataSet>>,std::less<OpenMD::Torsion*>,std::allocator<std::pair<OpenMD::Torsion*const,OpenMD::TorsionDataSet>>>
      ::_M_insert_unique<std::pair<OpenMD::Torsion*const,OpenMD::TorsionDataSet>>
                (p_Var2,(pair<OpenMD::Torsion_*const,_OpenMD::TorsionDataSet> *)&local_108);
    }
    else {
      p_Var1 = iVar5._M_node[2]._M_parent;
      iVar5._M_node[1]._M_left = *(_Base_ptr *)(iVar5._M_node + 2);
      iVar5._M_node[1]._M_right = p_Var1;
      *(key_type *)(iVar5._M_node + 2) = local_120;
      iVar5._M_node[2]._M_parent = local_130;
      iVar5._M_node[1]._M_parent = (_Base_ptr)ABS((double)local_130 - (double)p_Var1);
    }
    if ((this->doPotentialSelection_ == true) &&
       (((bVar3 = SelectionManager::isSelected
                            (this_00,&(*(local_138->super_ShortRangeInteraction).atoms_.
                                        super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>
                                        ._M_impl.super__Vector_impl_data._M_start)->
                                      super_StuntDouble), bVar3 ||
         (bVar3 = SelectionManager::isSelected
                            (this_00,&(local_138->super_ShortRangeInteraction).atoms_.
                                      super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>
                                      ._M_impl.super__Vector_impl_data._M_start[1]->
                                      super_StuntDouble), bVar3)) ||
        ((bVar3 = SelectionManager::isSelected
                            (this_00,&(local_138->super_ShortRangeInteraction).atoms_.
                                      super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>
                                      ._M_impl.super__Vector_impl_data._M_start[2]->
                                      super_StuntDouble), bVar3 ||
         (bVar3 = SelectionManager::isSelected
                            (this_00,&(local_138->super_ShortRangeInteraction).atoms_.
                                      super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>
                                      ._M_impl.super__Vector_impl_data._M_start[3]->
                                      super_StuntDouble), bVar3)))))) {
      local_a8.data_[6] = *(double *)((long)&(local_138->name_).field_2 + 8) + local_a8.data_[6];
    }
    if (ppTVar10 ==
        (mol2->torsions_).super__Vector_base<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      local_138 = (Inversion *)0x0;
    }
    else {
      local_138 = (key_type)*ppTVar10;
    }
    local_110 = (_Base_ptr)((double)local_110 + (double)local_130);
  }
  ppIVar11 = (mol2->inversions_).
             super__Vector_base<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  if (ppIVar11 ==
      (mol2->inversions_).
      super__Vector_base<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    local_140 = (Inversion *)0x0;
  }
  else {
    local_140 = *ppIVar11;
  }
  local_138 = (key_type)0x0;
  while (ppIVar11 = ppIVar11 + 1, local_140 != (Inversion *)0x0) {
    (*(local_140->super_ShortRangeInteraction)._vptr_ShortRangeInteraction[9])
              (local_140,&local_120,(ulong)this->doParticlePot_);
    local_130 = (_Base_ptr)local_140->potential_;
    iVar6 = std::
            _Rb_tree<OpenMD::Inversion_*,_std::pair<OpenMD::Inversion_*const,_OpenMD::InversionDataSet>,_std::_Select1st<std::pair<OpenMD::Inversion_*const,_OpenMD::InversionDataSet>_>,_std::less<OpenMD::Inversion_*>,_std::allocator<std::pair<OpenMD::Inversion_*const,_OpenMD::InversionDataSet>_>_>
            ::find(this_04,&local_140);
    if (iVar6._M_node == local_b8) {
      local_108.first = local_140;
      local_108.second.deltaV = 0.0;
      local_108.second.prev.angle = (RealType)local_120;
      local_108.second.prev.potential = (RealType)local_130;
      local_108.second.curr.angle = (RealType)local_120;
      local_108.second.curr.potential = (RealType)local_130;
      std::
      _Rb_tree<OpenMD::Inversion*,std::pair<OpenMD::Inversion*const,OpenMD::InversionDataSet>,std::_Select1st<std::pair<OpenMD::Inversion*const,OpenMD::InversionDataSet>>,std::less<OpenMD::Inversion*>,std::allocator<std::pair<OpenMD::Inversion*const,OpenMD::InversionDataSet>>>
      ::_M_insert_unique<std::pair<OpenMD::Inversion*const,OpenMD::InversionDataSet>>
                ((_Rb_tree<OpenMD::Inversion*,std::pair<OpenMD::Inversion*const,OpenMD::InversionDataSet>,std::_Select1st<std::pair<OpenMD::Inversion*const,OpenMD::InversionDataSet>>,std::less<OpenMD::Inversion*>,std::allocator<std::pair<OpenMD::Inversion*const,OpenMD::InversionDataSet>>>
                  *)this_04,&local_108);
    }
    else {
      p_Var1 = iVar6._M_node[2]._M_parent;
      iVar6._M_node[1]._M_left = *(_Base_ptr *)(iVar6._M_node + 2);
      iVar6._M_node[1]._M_right = p_Var1;
      *(key_type *)(iVar6._M_node + 2) = local_120;
      iVar6._M_node[2]._M_parent = local_130;
      iVar6._M_node[1]._M_parent = (_Base_ptr)ABS((double)local_130 - (double)p_Var1);
    }
    if ((this->doPotentialSelection_ == true) &&
       ((((bVar3 = SelectionManager::isSelected
                             (this_00,&(*(local_140->super_ShortRangeInteraction).atoms_.
                                         super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>
                                         ._M_impl.super__Vector_impl_data._M_start)->
                                       super_StuntDouble), bVar3 ||
          (bVar3 = SelectionManager::isSelected
                             (this_00,&(local_140->super_ShortRangeInteraction).atoms_.
                                       super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>
                                       ._M_impl.super__Vector_impl_data._M_start[1]->
                                       super_StuntDouble), bVar3)) ||
         (bVar3 = SelectionManager::isSelected
                            (this_00,&(local_140->super_ShortRangeInteraction).atoms_.
                                      super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>
                                      ._M_impl.super__Vector_impl_data._M_start[2]->
                                      super_StuntDouble), bVar3)) ||
        (bVar3 = SelectionManager::isSelected
                           (this_00,&(local_140->super_ShortRangeInteraction).atoms_.
                                     super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>
                                     ._M_impl.super__Vector_impl_data._M_start[3]->super_StuntDouble
                           ), bVar3)))) {
      local_a8.data_[6] = local_140->potential_ + local_a8.data_[6];
    }
    if (ppIVar11 ==
        (mol2->inversions_).
        super__Vector_base<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      local_140 = (Inversion *)0x0;
    }
    else {
      local_140 = *ppIVar11;
    }
    local_118 = (_Base_ptr)((double)local_118 + (double)local_130);
  }
  this_03 = this->info_->sman_->currentSnapshot_;
  Snapshot::setBondPotential(this_03,local_d0);
  Snapshot::setBendPotential(this_03,local_d8);
  Snapshot::setTorsionPotential(this_03,(RealType)local_110);
  Snapshot::setInversionPotential(this_03,(RealType)local_118);
  Vector<double,_7U>::Vector(&local_68,&local_a8);
  Snapshot::setSelectionPotentials(this_03,&local_68);
  return;
}

Assistant:

void ForceManager::selectedShortRangeInteractions(Molecule* mol1,
                                                    Molecule* mol2) {
    RigidBody* rb;
    Bond* bond;
    Bend* bend;
    Torsion* torsion;
    Inversion* inversion;
    SimInfo::MoleculeIterator mi;
    Molecule::RigidBodyIterator rbIter;
    Molecule::BondIterator bondIter;
    Molecule::BendIterator bendIter;
    Molecule::TorsionIterator torsionIter;
    Molecule::InversionIterator inversionIter;
    RealType bondPotential      = 0.0;
    RealType bendPotential      = 0.0;
    RealType torsionPotential   = 0.0;
    RealType inversionPotential = 0.0;
    potVec selectionPotential(0.0);

    // First compute for mol1
    for (rb = mol1->beginRigidBody(rbIter); rb != NULL;
         rb = mol1->nextRigidBody(rbIter)) {
      rb->updateAtoms();
    }

    for (bond = mol1->beginBond(bondIter); bond != NULL;
         bond = mol1->nextBond(bondIter)) {
      bond->calcForce(doParticlePot_);
      bondPotential += bond->getPotential();
      if (doPotentialSelection_) {
        if (seleMan_.isSelected(bond->getAtomA()) ||
            seleMan_.isSelected(bond->getAtomB())) {
          selectionPotential[BONDED_FAMILY] += bond->getPotential();
        }
      }
    }

    for (bend = mol1->beginBend(bendIter); bend != NULL;
         bend = mol1->nextBend(bendIter)) {
      RealType angle;
      bend->calcForce(angle, doParticlePot_);
      RealType currBendPot = bend->getPotential();

      bendPotential += bend->getPotential();
      map<Bend*, BendDataSet>::iterator i = bendDataSets.find(bend);
      if (i == bendDataSets.end()) {
        BendDataSet dataSet;
        dataSet.prev.angle = dataSet.curr.angle = angle;
        dataSet.prev.potential = dataSet.curr.potential = currBendPot;
        dataSet.deltaV                                  = 0.0;
        bendDataSets.insert(map<Bend*, BendDataSet>::value_type(bend, dataSet));
      } else {
        i->second.prev.angle     = i->second.curr.angle;
        i->second.prev.potential = i->second.curr.potential;
        i->second.curr.angle     = angle;
        i->second.curr.potential = currBendPot;
        i->second.deltaV =
            fabs(i->second.curr.potential - i->second.prev.potential);
      }
      if (doPotentialSelection_) {
        if (seleMan_.isSelected(bend->getAtomA()) ||
            seleMan_.isSelected(bend->getAtomB()) ||
            seleMan_.isSelected(bend->getAtomC())) {
          selectionPotential[BONDED_FAMILY] += bend->getPotential();
        }
      }
    }

    for (torsion = mol1->beginTorsion(torsionIter); torsion != NULL;
         torsion = mol1->nextTorsion(torsionIter)) {
      RealType angle;
      torsion->calcForce(angle, doParticlePot_);
      RealType currTorsionPot = torsion->getPotential();
      torsionPotential += torsion->getPotential();
      map<Torsion*, TorsionDataSet>::iterator i = torsionDataSets.find(torsion);
      if (i == torsionDataSets.end()) {
        TorsionDataSet dataSet;
        dataSet.prev.angle = dataSet.curr.angle = angle;
        dataSet.prev.potential = dataSet.curr.potential = currTorsionPot;
        dataSet.deltaV                                  = 0.0;
        torsionDataSets.insert(
            map<Torsion*, TorsionDataSet>::value_type(torsion, dataSet));
      } else {
        i->second.prev.angle     = i->second.curr.angle;
        i->second.prev.potential = i->second.curr.potential;
        i->second.curr.angle     = angle;
        i->second.curr.potential = currTorsionPot;
        i->second.deltaV =
            fabs(i->second.curr.potential - i->second.prev.potential);
      }
      if (doPotentialSelection_) {
        if (seleMan_.isSelected(torsion->getAtomA()) ||
            seleMan_.isSelected(torsion->getAtomB()) ||
            seleMan_.isSelected(torsion->getAtomC()) ||
            seleMan_.isSelected(torsion->getAtomD())) {
          selectionPotential[BONDED_FAMILY] += torsion->getPotential();
        }
      }
    }

    for (inversion = mol1->beginInversion(inversionIter); inversion != NULL;
         inversion = mol1->nextInversion(inversionIter)) {
      RealType angle;
      inversion->calcForce(angle, doParticlePot_);
      RealType currInversionPot = inversion->getPotential();
      inversionPotential += inversion->getPotential();
      map<Inversion*, InversionDataSet>::iterator i =
          inversionDataSets.find(inversion);
      if (i == inversionDataSets.end()) {
        InversionDataSet dataSet;
        dataSet.prev.angle = dataSet.curr.angle = angle;
        dataSet.prev.potential = dataSet.curr.potential = currInversionPot;
        dataSet.deltaV                                  = 0.0;
        inversionDataSets.insert(
            map<Inversion*, InversionDataSet>::value_type(inversion, dataSet));
      } else {
        i->second.prev.angle     = i->second.curr.angle;
        i->second.prev.potential = i->second.curr.potential;
        i->second.curr.angle     = angle;
        i->second.curr.potential = currInversionPot;
        i->second.deltaV =
            fabs(i->second.curr.potential - i->second.prev.potential);
      }
      if (doPotentialSelection_) {
        if (seleMan_.isSelected(inversion->getAtomA()) ||
            seleMan_.isSelected(inversion->getAtomB()) ||
            seleMan_.isSelected(inversion->getAtomC()) ||
            seleMan_.isSelected(inversion->getAtomD())) {
          selectionPotential[BONDED_FAMILY] += inversion->getPotential();
        }
      }
    }

    // Next compute for mol2
    for (rb = mol2->beginRigidBody(rbIter); rb != NULL;
         rb = mol2->nextRigidBody(rbIter)) {
      rb->updateAtoms();
    }

    for (bond = mol2->beginBond(bondIter); bond != NULL;
         bond = mol2->nextBond(bondIter)) {
      bond->calcForce(doParticlePot_);
      bondPotential += bond->getPotential();
      if (doPotentialSelection_) {
        if (seleMan_.isSelected(bond->getAtomA()) ||
            seleMan_.isSelected(bond->getAtomB())) {
          selectionPotential[BONDED_FAMILY] += bond->getPotential();
        }
      }
    }

    for (bend = mol2->beginBend(bendIter); bend != NULL;
         bend = mol2->nextBend(bendIter)) {
      RealType angle;
      bend->calcForce(angle, doParticlePot_);
      RealType currBendPot = bend->getPotential();

      bendPotential += bend->getPotential();
      map<Bend*, BendDataSet>::iterator i = bendDataSets.find(bend);
      if (i == bendDataSets.end()) {
        BendDataSet dataSet;
        dataSet.prev.angle = dataSet.curr.angle = angle;
        dataSet.prev.potential = dataSet.curr.potential = currBendPot;
        dataSet.deltaV                                  = 0.0;
        bendDataSets.insert(map<Bend*, BendDataSet>::value_type(bend, dataSet));
      } else {
        i->second.prev.angle     = i->second.curr.angle;
        i->second.prev.potential = i->second.curr.potential;
        i->second.curr.angle     = angle;
        i->second.curr.potential = currBendPot;
        i->second.deltaV =
            fabs(i->second.curr.potential - i->second.prev.potential);
      }
      if (doPotentialSelection_) {
        if (seleMan_.isSelected(bend->getAtomA()) ||
            seleMan_.isSelected(bend->getAtomB()) ||
            seleMan_.isSelected(bend->getAtomC())) {
          selectionPotential[BONDED_FAMILY] += bend->getPotential();
        }
      }
    }

    for (torsion = mol2->beginTorsion(torsionIter); torsion != NULL;
         torsion = mol2->nextTorsion(torsionIter)) {
      RealType angle;
      torsion->calcForce(angle, doParticlePot_);
      RealType currTorsionPot = torsion->getPotential();
      torsionPotential += torsion->getPotential();
      map<Torsion*, TorsionDataSet>::iterator i = torsionDataSets.find(torsion);
      if (i == torsionDataSets.end()) {
        TorsionDataSet dataSet;
        dataSet.prev.angle = dataSet.curr.angle = angle;
        dataSet.prev.potential = dataSet.curr.potential = currTorsionPot;
        dataSet.deltaV                                  = 0.0;
        torsionDataSets.insert(
            map<Torsion*, TorsionDataSet>::value_type(torsion, dataSet));
      } else {
        i->second.prev.angle     = i->second.curr.angle;
        i->second.prev.potential = i->second.curr.potential;
        i->second.curr.angle     = angle;
        i->second.curr.potential = currTorsionPot;
        i->second.deltaV =
            fabs(i->second.curr.potential - i->second.prev.potential);
      }
      if (doPotentialSelection_) {
        if (seleMan_.isSelected(torsion->getAtomA()) ||
            seleMan_.isSelected(torsion->getAtomB()) ||
            seleMan_.isSelected(torsion->getAtomC()) ||
            seleMan_.isSelected(torsion->getAtomD())) {
          selectionPotential[BONDED_FAMILY] += torsion->getPotential();
        }
      }
    }

    for (inversion = mol2->beginInversion(inversionIter); inversion != NULL;
         inversion = mol2->nextInversion(inversionIter)) {
      RealType angle;
      inversion->calcForce(angle, doParticlePot_);
      RealType currInversionPot = inversion->getPotential();
      inversionPotential += inversion->getPotential();
      map<Inversion*, InversionDataSet>::iterator i =
          inversionDataSets.find(inversion);
      if (i == inversionDataSets.end()) {
        InversionDataSet dataSet;
        dataSet.prev.angle = dataSet.curr.angle = angle;
        dataSet.prev.potential = dataSet.curr.potential = currInversionPot;
        dataSet.deltaV                                  = 0.0;
        inversionDataSets.insert(
            map<Inversion*, InversionDataSet>::value_type(inversion, dataSet));
      } else {
        i->second.prev.angle     = i->second.curr.angle;
        i->second.prev.potential = i->second.curr.potential;
        i->second.curr.angle     = angle;
        i->second.curr.potential = currInversionPot;
        i->second.deltaV =
            fabs(i->second.curr.potential - i->second.prev.potential);
      }
      if (doPotentialSelection_) {
        if (seleMan_.isSelected(inversion->getAtomA()) ||
            seleMan_.isSelected(inversion->getAtomB()) ||
            seleMan_.isSelected(inversion->getAtomC()) ||
            seleMan_.isSelected(inversion->getAtomD())) {
          selectionPotential[BONDED_FAMILY] += inversion->getPotential();
        }
      }
    }

#ifdef IS_MPI
    // Collect from all nodes.  This should eventually be moved into a
    // SystemDecomposition, but this is a better place than in
    // Thermo to do the collection.

    MPI_Allreduce(MPI_IN_PLACE, &bondPotential, 1, MPI_REALTYPE, MPI_SUM,
                  MPI_COMM_WORLD);
    MPI_Allreduce(MPI_IN_PLACE, &bendPotential, 1, MPI_REALTYPE, MPI_SUM,
                  MPI_COMM_WORLD);
    MPI_Allreduce(MPI_IN_PLACE, &torsionPotential, 1, MPI_REALTYPE, MPI_SUM,
                  MPI_COMM_WORLD);
    MPI_Allreduce(MPI_IN_PLACE, &inversionPotential, 1, MPI_REALTYPE, MPI_SUM,
                  MPI_COMM_WORLD);
    MPI_Allreduce(MPI_IN_PLACE, &selectionPotential[BONDED_FAMILY], 1,
                  MPI_REALTYPE, MPI_SUM, MPI_COMM_WORLD);
#endif

    Snapshot* curSnapshot = info_->getSnapshotManager()->getCurrentSnapshot();

    curSnapshot->setBondPotential(bondPotential);
    curSnapshot->setBendPotential(bendPotential);
    curSnapshot->setTorsionPotential(torsionPotential);
    curSnapshot->setInversionPotential(inversionPotential);
    curSnapshot->setSelectionPotentials(selectionPotential);

    // RealType shortRangePotential = bondPotential + bendPotential +
    //   torsionPotential +  inversionPotential;

    // curSnapshot->setShortRangePotential(shortRangePotential);
  }